

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_fpcall2(jit_State *J)

{
  long in_RDI;
  uint64_t u64;
  double y;
  double b;
  double a;
  CCallInfo *ci;
  TValue tv;
  jit_State *J_00;
  TRef local_1c;
  
  if ((*(ushort *)(in_RDI + 0xa8) < 0x8000) && (*(ushort *)(in_RDI + 0xaa) < 0x8000)) {
    J_00 = *(jit_State **)(*(long *)(in_RDI + 0x10) + 8 + (ulong)*(ushort *)(in_RDI + 0xaa) * 8);
    u64 = (*lj_ir_callinfo[*(ushort *)(in_RDI + 0xa2)].func)
                    (*(undefined8 *)
                      (*(long *)(in_RDI + 0x10) + 8 + (ulong)*(ushort *)(in_RDI + 0xa8) * 8),J_00);
    local_1c = lj_ir_knum_u64(J_00,u64);
  }
  else {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

LJFOLD(CALLN CARG IRCALL_atan2)
LJFOLDF(kfold_fpcall2)
{
  if (irref_isk(fleft->op1) && irref_isk(fleft->op2)) {
    const CCallInfo *ci = &lj_ir_callinfo[fins->op2];
    double a = ir_knum(IR(fleft->op1))->n;
    double b = ir_knum(IR(fleft->op2))->n;
    double y = ((double (*)(double, double))ci->func)(a, b);
    return lj_ir_knum(J, y);
  }
  return NEXTFOLD;
}